

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DifferentialTest.h
# Opt level: O0

bool DiffTest<Blob<128>,unsigned_long>(pfHash hash,int diffbits,int reps,bool dumpCollisions)

{
  bool bVar1;
  uint in_EDX;
  uint in_ESI;
  code *in_RDI;
  double dVar2;
  double dVar3;
  bool result;
  int i;
  unsigned_long h2;
  unsigned_long h1;
  Blob<128> k2;
  Blob<128> k1;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> diffs;
  Rand r;
  double expected;
  double testcount;
  double diffcount;
  int hashbits;
  int keybits;
  uint32_t in_stack_ffffffffffffff2c;
  Rand *in_stack_ffffffffffffff30;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  Rand *this;
  int iVar4;
  int start;
  unsigned_long *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> *in_stack_ffffffffffffff70;
  Blob<128> *in_stack_ffffffffffffff78;
  pfHash in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff90;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> *in_stack_ffffffffffffff98;
  
  dVar2 = chooseUpToK((int)((ulong)in_stack_ffffffffffffff30 >> 0x20),(int)in_stack_ffffffffffffff30
                     );
  this = (Rand *)(dVar2 * (double)(int)in_EDX);
  dVar3 = pow(2.0,64.0);
  dVar3 = (double)this / dVar3;
  Rand::Rand(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
  std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::vector
            ((vector<Blob<128>,_std::allocator<Blob<128>_>_> *)0x14af8e);
  Blob<128>::Blob((Blob<128> *)&stack0xffffffffffffff90);
  Blob<128>::Blob((Blob<128> *)&stack0xffffffffffffff74);
  printf("Testing %0.f up-to-%d-bit differentials in %d-bit keys -> %d bit hashes.\n",dVar2,
         (ulong)in_ESI,0x80,0x40);
  printf("%d reps, %0.f total tests, expecting %2.2f random collisions",
         (Rand *)(dVar2 * (double)(int)in_EDX),dVar3,(ulong)in_EDX);
  iVar4 = 0;
  while (iVar4 < (int)in_EDX) {
    start = iVar4;
    if (iVar4 % ((int)in_EDX / 10) == 0) {
      printf(".");
    }
    Rand::rand_p(this,(void *)CONCAT44(iVar4,in_stack_ffffffffffffff48),
                 (int)((ulong)in_stack_ffffffffffffff40 >> 0x20));
    in_stack_ffffffffffffff40 =
         (vector<Blob<128>,_std::allocator<Blob<128>_>_> *)&stack0xffffffffffffff90;
    Blob<128>::operator=
              ((Blob<128> *)&stack0xffffffffffffff74,(Blob<128> *)in_stack_ffffffffffffff40);
    (*in_RDI)(in_stack_ffffffffffffff40,0x10,0,&stack0xffffffffffffff68);
    DiffTestRecurse<Blob<128>,unsigned_long>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
               (Blob<128> *)in_stack_ffffffffffffff70,
               (unsigned_long *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
               in_stack_ffffffffffffff60,start,in_stack_ffffffffffffff90,in_stack_ffffffffffffff98);
    iVar4 = start + 1;
  }
  printf("\n");
  bVar1 = ProcessDifferentials<Blob<128>>
                    (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                     SUB41((uint)in_stack_ffffffffffffff68 >> 0x18,0));
  std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::~vector(in_stack_ffffffffffffff40);
  return bVar1;
}

Assistant:

bool DiffTest ( pfHash hash, int diffbits, int reps, bool dumpCollisions )
{
  const int keybits = sizeof(keytype) * 8;
  const int hashbits = sizeof(hashtype) * 8;

  double diffcount = chooseUpToK(keybits,diffbits);
  double testcount = (diffcount * double(reps));
  double expected  = testcount / pow(2.0,double(hashbits));

  Rand r(100);

  std::vector<keytype> diffs;

  keytype k1,k2;
  hashtype h1,h2;

  printf("Testing %0.f up-to-%d-bit differentials in %d-bit keys -> %d bit hashes.\n",
         diffcount,diffbits,keybits,hashbits);
  printf("%d reps, %0.f total tests, expecting %2.2f random collisions",
         reps,testcount,expected);

  for(int i = 0; i < reps; i++)
  {
    if(i % (reps/10) == 0) printf(".");

    r.rand_p(&k1,sizeof(keytype));
    k2 = k1;

    hash(&k1,sizeof(k1),0,(uint32_t*)&h1);

    DiffTestRecurse<keytype,hashtype>(hash,k1,k2,h1,h2,0,diffbits,diffs);
  }
  printf("\n");

  bool result = true;

  result &= ProcessDifferentials(diffs,reps,dumpCollisions);

  return result;
}